

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void parse_decode_block(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *r,
                       PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  uint8_t uVar1;
  BLOCK_SIZE BVar2;
  _Bool _Var3;
  _Bool _Var4;
  ushort uVar5;
  SequenceHeader *pSVar6;
  MB_MODE_INFO **ppMVar7;
  MB_MODE_INFO *mbmi_00;
  MB_MODE_INFO *pMVar8;
  uint8_t txs;
  uint8_t txs_00;
  int16_t iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  uint bh;
  uint bw;
  int iVar13;
  uint num_planes;
  int16_t *piVar14;
  uint uVar15;
  byte bVar16;
  ENTROPY_CONTEXT **ppEVar17;
  ENTROPY_CONTEXT (*paEVar18) [32];
  byte bVar19;
  uint y_mis;
  byte bVar20;
  int idy;
  ulong uVar21;
  int idx;
  uint uVar22;
  int iVar23;
  int y;
  int iVar24;
  uint uVar25;
  int16_t *piVar26;
  bool bVar27;
  undefined4 uVar28;
  undefined1 auVar29 [16];
  MB_MODE_INFO *mbmi;
  
  pSVar6 = (pbi->common).seq_params;
  uVar21 = (ulong)bsize;
  bh = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar21];
  iVar24 = (pbi->common).mi_params.mi_rows;
  uVar15 = (pbi->common).mi_params.mi_cols - mi_col;
  bw = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar21];
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [uVar21] <= (int)uVar15) {
    uVar15 = bw;
  }
  uVar1 = pSVar6->monochrome;
  iVar13 = (pbi->common).mi_params.mi_stride;
  iVar10 = iVar13 * mi_row + mi_col;
  (pbi->common).mi_params.mi_grid_base[iVar10] =
       (pbi->common).mi_params.mi_alloc +
       ((mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [(pbi->common).mi_params.mi_alloc_bsize]) *
        (pbi->common).mi_params.mi_alloc_stride +
       mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [(pbi->common).mi_params.mi_alloc_bsize]);
  ppMVar7 = (pbi->common).mi_params.mi_grid_base + iVar10;
  (td->dcb).xd.mi = ppMVar7;
  (td->dcb).xd.tx_type_map = (pbi->common).mi_params.tx_type_map + iVar10;
  (td->dcb).xd.tx_type_map_stride = iVar13;
  (*ppMVar7)->bsize = bsize;
  for (lVar11 = 1; lVar11 < (int)uVar15; lVar11 = lVar11 + 1) {
    ppMVar7 = (td->dcb).xd.mi;
    ppMVar7[lVar11] = *ppMVar7;
  }
  y_mis = iVar24 - mi_row;
  if ((int)bh <= (int)y_mis) {
    y_mis = bh;
  }
  for (iVar24 = 1; iVar24 < (int)y_mis; iVar24 = iVar24 + 1) {
    ppMVar7 = (td->dcb).xd.mi;
    memcpy(ppMVar7 + iVar13,ppMVar7,(long)(int)uVar15 << 3);
    iVar13 = iVar13 + (pbi->common).mi_params.mi_stride;
  }
  bVar27 = uVar1 == '\0';
  num_planes = bVar27 + 1 + (uint)bVar27;
  set_plane_n4((MACROBLOCKD *)td,bw,bh,num_planes);
  ppEVar17 = (td->dcb).xd.above_entropy_context;
  paEVar18 = (td->dcb).xd.left_entropy_context;
  ppMVar7 = (td->dcb).xd.mi;
  iVar24 = mi_col;
  uVar22 = mi_row;
  for (lVar11 = 0; (ulong)num_planes * 0xa30 - lVar11 != 0; lVar11 = lVar11 + 0xa30) {
    BVar2 = (*ppMVar7)->bsize;
    uVar25 = mi_row - 1;
    if ((0x20005UL >> (BVar2 & 0x3f) & 1) == 0) {
      uVar25 = uVar22;
    }
    iVar13 = *(int *)((long)(td->dcb).xd.plane[0].pre + lVar11 + -0x28);
    if (iVar13 == 0) {
      uVar25 = uVar22;
    }
    if ((mi_row & 1U) != 0) {
      uVar22 = uVar25;
    }
    iVar10 = mi_col + -1;
    if ((0x10003UL >> (BVar2 & 0x3f) & 1) == 0) {
      iVar10 = iVar24;
    }
    iVar23 = *(int *)((long)(td->dcb).xd.plane[0].pre + lVar11 + -0x2c);
    if (iVar23 == 0) {
      iVar10 = iVar24;
    }
    if ((mi_col & 1U) != 0) {
      iVar24 = iVar10;
    }
    *(ENTROPY_CONTEXT **)((long)((td->dcb).xd.plane[0].seg_dequant_QTX + -4) + lVar11) =
         *ppEVar17 + (iVar24 >> ((byte)iVar23 & 0x1f));
    *(ENTROPY_CONTEXT **)((long)((td->dcb).xd.plane[0].seg_dequant_QTX + -2) + lVar11) =
         *paEVar18 + ((uVar22 & 0x1f) >> ((byte)iVar13 & 0x1f));
    paEVar18 = paEVar18 + 1;
    ppEVar17 = ppEVar17 + 1;
  }
  set_mi_row_col((MACROBLOCKD *)td,&(td->dcb).xd.tile,mi_row,bh,mi_col,bw,
                 (pbi->common).mi_params.mi_rows,(pbi->common).mi_params.mi_cols);
  av1_setup_dst_planes
            ((td->dcb).xd.plane,bsize,&((pbi->common).cur_frame)->buf,mi_row,mi_col,0,num_planes);
  (*(td->dcb).xd.mi)->partition = partition;
  av1_read_mode_info(pbi,&td->dcb,r,uVar15,y_mis);
  if (BLOCK_8X4 < bsize) {
    if ((pSVar6->subsampling_x != 0 || pSVar6->subsampling_y != 0) &&
       (av1_ss_size_lookup[uVar21][pSVar6->subsampling_x][pSVar6->subsampling_y] == BLOCK_INVALID))
    {
      aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid block size.");
    }
  }
  av1_visit_palette(pbi,(MACROBLOCKD *)td,r,av1_decode_palette_tokens);
  uVar1 = ((pbi->common).seq_params)->monochrome;
  mbmi_00 = *(td->dcb).xd.mi;
  uVar5 = *(ushort *)&mbmi_00->field_0xa7;
  bVar27 = true;
  if (-1 < (char)uVar5) {
    bVar27 = '\0' < mbmi_00->ref_frame[0];
  }
  bVar16 = (pbi->common).features.tx_mode;
  if (((bsize == BLOCK_4X4 || (ulong)bVar16 != 2) ||
      ((bool)(bVar27 ^ 1) || mbmi_00->skip_txfm != '\0')) || ((td->dcb).xd.lossless[uVar5 & 7] != 0)
     ) {
    BVar2 = mbmi_00->bsize;
    if (BVar2 == BLOCK_4X4 || (td->dcb).xd.lossless[uVar5 & 7] != 0) {
      bVar20 = 0;
    }
    else if ((bVar16 == 2) && ((bool)(mbmi_00->skip_txfm == '\0' | bVar27 ^ 1U))) {
      bVar20 = ""[BVar2];
      _Var3 = (td->dcb).xd.up_available;
      _Var4 = (td->dcb).xd.left_available;
      bVar16 = *(td->dcb).xd.above_txfm_context;
      if ((_Var3 == true) &&
         ((pMVar8 = (td->dcb).xd.above_mbmi, (pMVar8->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar8->ref_frame[0])))) {
        bVar16 = block_size_wide[pMVar8->bsize];
      }
      bVar19 = *(td->dcb).xd.left_txfm_context;
      if ((_Var4 != false) &&
         ((pMVar8 = (td->dcb).xd.left_mbmi, (pMVar8->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar8->ref_frame[0])))) {
        bVar19 = block_size_high[pMVar8->bsize];
      }
      iVar13 = aom_read_symbol_(r,((td->dcb).xd.tile_ctx)->tx_size_cdf
                                  [(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table
                                                [BVar2] - 1]
                                  [(uint)(byte)(_Var4 & *(int *)((long)tx_size_high +
                                                                (ulong)((uint)bVar20 * 4)) <=
                                                        (int)(uint)bVar19) +
                                   (uint)(byte)(_Var3 & *(int *)((long)tx_size_wide +
                                                                (ulong)((uint)bVar20 * 4)) <=
                                                        (int)(uint)bVar16)],
                                (byte)bsize_to_max_depth_bsize_to_max_depth_table[BVar2] + 1);
      iVar24 = 0;
      if (0 < iVar13) {
        iVar24 = iVar13;
      }
      while( true ) {
        if (iVar24 == 0) break;
        bVar20 = ""[bVar20];
        iVar24 = iVar24 + -1;
      }
    }
    else {
      bVar20 = ""[BVar2];
      if (""[bVar16] < ""[""[BVar2]]) {
        bVar20 = ""[bVar16];
      }
    }
    mbmi_00->tx_size = bVar20;
    if (bVar27) {
      auVar29 = pshuflw(ZEXT216(CONCAT11(bVar20,bVar20)),ZEXT216(CONCAT11(bVar20,bVar20)),0);
      uVar28 = auVar29._0_4_;
      *(undefined4 *)mbmi_00->inter_tx_size = uVar28;
      *(undefined4 *)(mbmi_00->inter_tx_size + 4) = uVar28;
      *(undefined4 *)(mbmi_00->inter_tx_size + 8) = uVar28;
      *(undefined4 *)(mbmi_00->inter_tx_size + 0xc) = uVar28;
    }
    bVar16 = (td->dcb).xd.width;
    bVar19 = (td->dcb).xd.height;
    if (mbmi_00->skip_txfm == '\0') {
      bVar27 = true;
    }
    else if ((mbmi_00->field_0xa7 & 0x80) == 0) {
      bVar27 = mbmi_00->ref_frame[0] < '\x01';
    }
    else {
      bVar27 = false;
    }
    txs = bVar16 * '\x04';
    if (bVar27) {
      txs = (uint8_t)tx_size_wide[bVar20];
    }
    txs_00 = bVar19 * '\x04';
    if (bVar27) {
      txs_00 = (uint8_t)tx_size_high[bVar20];
    }
    set_txfm_ctx((td->dcb).xd.above_txfm_context,txs,(uint)bVar16);
    set_txfm_ctx((td->dcb).xd.left_txfm_context,txs_00,(uint)bVar19);
  }
  else {
    bVar16 = ""[uVar21];
    iVar24 = tx_size_high_unit[bVar16];
    iVar13 = tx_size_wide_unit[bVar16];
    for (iVar10 = 0; iVar10 < (int)bh; iVar10 = iVar10 + iVar24) {
      for (iVar23 = 0; iVar23 < (int)bw; iVar23 = iVar23 + iVar13) {
        read_tx_size_vartx((MACROBLOCKD *)td,mbmi_00,bVar16,0,iVar10,iVar23,r);
      }
    }
  }
  uVar15 = (uint)(uVar1 == '\0') * 2 + 1;
  if ((pbi->common).delta_q_info.delta_q_present_flag != 0) {
    piVar26 = (td->dcb).xd.plane[0].seg_dequant_QTX[0] + 1;
    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
      iVar24 = av1_get_qindex(&(pbi->common).seg,(int)lVar11,(td->dcb).xd.current_base_qindex);
      piVar14 = piVar26;
      for (uVar21 = 0; uVar15 != uVar21; uVar21 = uVar21 + 1) {
        if ((int)uVar21 == 1) {
          iVar13 = (pbi->common).quant_params.u_ac_delta_q;
          piVar12 = &(pbi->common).quant_params.u_dc_delta_q;
        }
        else if ((int)uVar21 == 0) {
          iVar13 = 0;
          piVar12 = &(pbi->common).quant_params.y_dc_delta_q;
        }
        else {
          iVar13 = (pbi->common).quant_params.v_ac_delta_q;
          piVar12 = &(pbi->common).quant_params.v_dc_delta_q;
        }
        iVar9 = av1_dc_quant_QTX(iVar24,*piVar12,((pbi->common).seq_params)->bit_depth);
        (*(int16_t (*) [2])(piVar14 + -1))[0] = iVar9;
        iVar9 = av1_ac_quant_QTX(iVar24,iVar13,((pbi->common).seq_params)->bit_depth);
        *piVar14 = iVar9;
        piVar14 = piVar14 + 0x518;
      }
      piVar26 = piVar26 + 2;
    }
  }
  if (mbmi_00->skip_txfm != '\0') {
    av1_reset_entropy_context((MACROBLOCKD *)td,bsize,uVar15);
  }
  decode_token_recon_block(pbi,td,r,bsize);
  return;
}

Assistant:

static inline void parse_decode_block(AV1Decoder *const pbi,
                                      ThreadData *const td, int mi_row,
                                      int mi_col, aom_reader *r,
                                      PARTITION_TYPE partition,
                                      BLOCK_SIZE bsize) {
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  decode_mbmi_block(pbi, dcb, mi_row, mi_col, r, partition, bsize);

  av1_visit_palette(pbi, xd, r, av1_decode_palette_tokens);

  AV1_COMMON *cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  int inter_block_tx = is_inter_block(mbmi) || is_intrabc_block(mbmi);
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !mbmi->skip_txfm && inter_block_tx && !xd->lossless[mbmi->segment_id]) {
    const TX_SIZE max_tx_size = max_txsize_rect_lookup[bsize];
    const int bh = tx_size_high_unit[max_tx_size];
    const int bw = tx_size_wide_unit[max_tx_size];
    const int width = mi_size_wide[bsize];
    const int height = mi_size_high[bsize];

    for (int idy = 0; idy < height; idy += bh)
      for (int idx = 0; idx < width; idx += bw)
        read_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, r);
  } else {
    mbmi->tx_size = read_tx_size(xd, cm->features.tx_mode, inter_block_tx,
                                 !mbmi->skip_txfm, r);
    if (inter_block_tx)
      memset(mbmi->inter_tx_size, mbmi->tx_size, sizeof(mbmi->inter_tx_size));
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  mbmi->skip_txfm && is_inter_block(mbmi), xd);
  }

  if (cm->delta_q_info.delta_q_present_flag) {
    for (int i = 0; i < MAX_SEGMENTS; i++) {
      const int current_qindex =
          av1_get_qindex(&cm->seg, i, xd->current_base_qindex);
      const CommonQuantParams *const quant_params = &cm->quant_params;
      for (int j = 0; j < num_planes; ++j) {
        const int dc_delta_q = j == 0 ? quant_params->y_dc_delta_q
                                      : (j == 1 ? quant_params->u_dc_delta_q
                                                : quant_params->v_dc_delta_q);
        const int ac_delta_q = j == 0 ? 0
                                      : (j == 1 ? quant_params->u_ac_delta_q
                                                : quant_params->v_ac_delta_q);
        xd->plane[j].seg_dequant_QTX[i][0] = av1_dc_quant_QTX(
            current_qindex, dc_delta_q, cm->seq_params->bit_depth);
        xd->plane[j].seg_dequant_QTX[i][1] = av1_ac_quant_QTX(
            current_qindex, ac_delta_q, cm->seq_params->bit_depth);
      }
    }
  }
  if (mbmi->skip_txfm) av1_reset_entropy_context(xd, bsize, num_planes);

  decode_token_recon_block(pbi, td, r, bsize);
}